

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fftopn(fitsfile **fptr,char *name,int mode,int *status)

{
  int iVar1;
  fitsfile *in_RCX;
  int hdutype;
  int *in_stack_000034e0;
  int in_stack_000034ec;
  char *in_stack_000034f0;
  fitsfile **in_stack_000034f8;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_4;
  
  if (in_RCX->HDUposition < 1) {
    in_RCX->HDUposition = -0x67;
    ffopen(in_stack_000034f8,in_stack_000034f0,in_stack_000034ec,in_stack_000034e0);
    iVar1 = ffghdt(in_RCX,(int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
    if ((iVar1 < 1) && (in_stack_ffffffffffffffd4 == 0)) {
      in_RCX->HDUposition = 0xeb;
    }
    local_4 = in_RCX->HDUposition;
  }
  else {
    local_4 = in_RCX->HDUposition;
  }
  return local_4;
}

Assistant:

int fftopn(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           const char *name,     /* I - full name of file to open           */
           int mode,             /* I - 0 = open readonly; 1 = read/write   */
           int *status)          /* IO - error status                       */
/*
  Open an existing FITS file with either readonly or read/write access. and
  move to the first HDU that contains 'interesting' table (not an image). 
*/
{
    int hdutype;

    if (*status > 0)
        return(*status);

    *status = SKIP_IMAGE;

    ffopen(fptr, name, mode, status);

    if (ffghdt(*fptr, &hdutype, status) <= 0) {
        if (hdutype == IMAGE_HDU)
            *status = NOT_TABLE;
    }

    return(*status);
}